

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickup.c
# Opt level: O2

int lift_object(obj *obj,obj *container,long *cnt_p,boolean telekinesis)

{
  long lVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  long lVar10;
  obj *poVar11;
  char *pcVar12;
  char *pcVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  char *pcVar20;
  bool bVar21;
  bool bVar22;
  uint local_238;
  undefined1 uStack_234;
  undefined2 uStack_233;
  undefined4 uStack_231;
  undefined4 uStack_22d;
  undefined4 uStack_229;
  char obj_nambuf [256];
  
  if (obj->otyp == 0x210) {
    return 1;
  }
  if (obj->otyp == 0x214) {
    if (u.uz.dnum == dungeon_topology.d_sokoban_dnum) {
      pcVar7 = body_part(6);
      pcVar8 = xname(obj);
      pline("You cannot get your %s around this %s.",pcVar7,pcVar8);
      return -1;
    }
    if (((youmonst.data)->mflags2 & 0x8000000) != 0) {
      return 1;
    }
  }
  lVar1 = *cnt_p;
  bVar21 = true;
  bVar22 = true;
  if (container != &zeroobj && container != (obj *)0x0) {
    bVar21 = container->where != '\x03';
    bVar22 = container->otyp != 0xe0;
  }
  cVar2 = obj->oclass;
  lVar9 = money_cnt(invent);
  uVar6 = obj->owt;
  iVar4 = obj->quan;
  iVar3 = max_capacity();
  if (lVar1 == iVar4) {
    uVar14 = obj->owt;
  }
  else {
    obj->quan = (int)lVar1;
    uVar14 = weight(obj);
    obj->owt = uVar14;
  }
  iVar15 = uVar14 + iVar3;
  if (!bVar21) {
    if (!bVar22) {
      if ((*(uint *)&container->field_0x4a & 1) == 0) {
        if ((*(uint *)&container->field_0x4a & 2) == 0) {
          uVar14 = uVar14 + 1 >> 1;
        }
        else {
          uVar14 = uVar14 + 3 >> 2;
        }
      }
      else {
        uVar14 = uVar14 * 2;
      }
    }
    iVar15 = iVar15 - uVar14;
  }
  if (cVar2 == '\f') {
    iVar15 = iVar15 + (int)((lVar9 + lVar1 + 0x32) / 100) +
             (int)((lVar9 + 0x32) / -100) + (int)((lVar1 + 0x32) / -100);
  }
  if (lVar1 != iVar4) {
    obj->quan = iVar4;
    obj->owt = uVar6;
  }
  if (iVar15 < 0) {
    *cnt_p = lVar1;
    if (0 < lVar1) goto LAB_002058f4;
  }
  else {
    if (cVar2 == '\f') {
      lVar18 = lVar9 + 0x32;
      uVar14 = (int)(lVar18 / -100) + iVar3;
      if (bVar21) {
        lVar17 = ((long)(int)uVar14 * -100 - lVar9) + -0x33;
      }
      else {
        lVar17 = 0x31;
        if (0x31 < lVar9 % 100) {
          lVar17 = 0x95;
        }
        iVar15 = 0;
        for (lVar17 = lVar17 - lVar9 % 100; lVar17 <= lVar1; lVar17 = lVar17 + 100) {
          obj->quan = (int)lVar17;
          uVar16 = (uint)((lVar17 + 0x32) / 100);
          obj->owt = uVar16;
          if (!bVar22) {
            if ((*(uint *)&container->field_0x4a & 1) == 0) {
              if ((*(uint *)&container->field_0x4a & 2) == 0) {
                uVar16 = uVar16 + 1 >> 1;
              }
              else {
                uVar16 = uVar16 + 3 >> 2;
              }
            }
            else {
              uVar16 = uVar16 * 2;
            }
          }
          iVar5 = (int)((lVar18 + lVar17) / 100) - uVar16;
          if ((int)~uVar14 < iVar5) break;
          iVar15 = iVar5;
        }
        uVar14 = uVar14 - iVar15;
        lVar17 = lVar17 + -100;
      }
      lVar10 = lVar1;
      if (lVar17 < lVar1) {
        lVar10 = lVar17;
      }
      lVar19 = 0;
      if (-1 < lVar17) {
        lVar19 = lVar10;
      }
      iVar15 = (int)((lVar18 + lVar19) / 100) + uVar14;
    }
    else if ((lVar1 < 2) && (obj->quan <= lVar1)) {
      lVar19 = 0;
    }
    else {
      lVar18 = 0;
      if (0 < lVar1) {
        lVar18 = lVar1;
      }
      for (lVar17 = 1; lVar19 = lVar18 + 1, lVar17 - lVar18 != 1; lVar17 = lVar17 + 1) {
        obj->quan = (int)lVar17;
        uVar14 = weight(obj);
        obj->owt = uVar14;
        if (!bVar21) {
          uVar16 = uVar14;
          if (!bVar22) {
            if ((*(uint *)&container->field_0x4a & 1) == 0) {
              if ((*(uint *)&container->field_0x4a & 2) == 0) {
                uVar16 = uVar14 + 1 >> 1;
              }
              else {
                uVar16 = uVar14 + 3 >> 2;
              }
            }
            else {
              uVar16 = uVar14 * 2;
            }
          }
          uVar14 = uVar14 - uVar16;
        }
        lVar19 = lVar17;
        if (-1 < (int)(uVar14 + iVar3)) break;
        iVar15 = uVar14 + iVar3;
      }
      lVar19 = lVar19 + -1;
    }
    obj->quan = iVar4;
    obj->owt = uVar6;
    if (lVar19 < lVar1) {
      pcVar7 = doname(obj);
      strcpy(obj_nambuf,pcVar7);
      if (container == (obj *)0x0) {
        local_238 = 0x6e69796c;
        uStack_234 = 0x67;
        uStack_233 = 0x6820;
        uStack_231 = 0x657265;
        pcVar7 = "acquire";
        if (telekinesis == '\0') {
          pcVar7 = "lift";
        }
      }
      else {
        if (container == &zeroobj) {
          local_238 = 0x74206e69;
          uStack_234 = 0x68;
          uStack_233 = 0x2065;
          uStack_231 = 0x6967616d;
          uStack_22d = 0x68632063;
          uStack_229 = 0x747365;
        }
        else {
          pcVar7 = xname(container);
          pcVar7 = the(pcVar7);
          sprintf((char *)&local_238,"in %s",pcVar7);
        }
        pcVar7 = "carry";
      }
      if (lVar19 < 1) {
LAB_00205a16:
        if (container == (obj *)0x0) {
          uStack_234 = 0;
          local_238 = 0x65726568;
        }
        if (invent == (obj *)0x0 && lVar9 == 0) {
          pcVar8 = "even one ";
          if (obj->quan == 1) {
            pcVar8 = "it ";
          }
          pcVar20 = "";
          pcVar12 = "is too heavy for you to ";
        }
        else {
          pcVar20 = " any more";
          pcVar12 = "";
          pcVar8 = "you cannot ";
        }
        pcVar13 = otense(obj,"are");
        pline("There %s %s %s, but %s%s%s%s.",pcVar13,obj_nambuf,&local_238,pcVar8,pcVar12,pcVar7,
              pcVar20);
        *cnt_p = 0;
        goto LAB_00205acb;
      }
      pcVar8 = "some";
      if (lVar19 == 1) {
        pcVar8 = "one";
      }
      pline("You can only %s %s of the %s %s.",pcVar7,pcVar8,obj_nambuf,&local_238);
    }
    else {
      local_238 = local_238 & 0xffffff00;
      obj_nambuf[0] = '\0';
      if (lVar19 < 1) {
        pcVar7 = "";
        goto LAB_00205a16;
      }
    }
    *cnt_p = lVar19;
LAB_002058f4:
    iVar4 = inv_cnt();
    if ((iVar4 < 0x34) || (poVar11 = merge_choice(invent,obj), poVar11 != (obj *)0x0)) {
      iVar5 = near_capacity();
      iVar4 = flags.pickup_burden;
      if (flags.pickup_burden < iVar5) {
        iVar4 = iVar5;
      }
      iVar3 = calc_capacity(iVar15 - iVar3);
      if (iVar4 < iVar3) {
        uVar6 = 0;
        if (telekinesis == '\0') {
          pcVar7 = "You have a little trouble lifting";
          if (iVar3 == 3) {
            pcVar7 = "You have much trouble lifting";
          }
          iVar4 = obj->quan;
          obj->quan = (int)*cnt_p;
          pcVar8 = "You have extreme difficulty lifting";
          if (iVar3 < 4) {
            pcVar8 = pcVar7;
          }
          strcpy(obj_nambuf,pcVar8);
          pcVar7 = eos(obj_nambuf);
          pcVar8 = doname(obj);
          pcVar12 = simple_typename((int)obj->otyp);
          pcVar12 = an(pcVar12);
          pcVar8 = safe_qbuf(obj_nambuf,0xd,pcVar8,pcVar12,"something");
          sprintf(pcVar7," %s. Continue?",pcVar8);
          obj->quan = iVar4;
          cVar2 = yn_function(obj_nambuf,"ynq",'q');
          uVar6 = 0xffffffff;
          if (cVar2 != 'q') {
            uVar6 = (uint)(cVar2 != 'n');
          }
        }
      }
      else {
        uVar6 = 1;
      }
      goto LAB_00205ace;
    }
    pline("Your knapsack cannot accommodate any more items.");
  }
LAB_00205acb:
  uVar6 = 0xffffffff;
LAB_00205ace:
  if (((container == (obj *)0x0) && ((int)uVar6 < 1)) && (obj->otyp == 0x155)) {
    obj->spe = '\0';
  }
  return uVar6;
}

Assistant:

static int lift_object(struct obj *obj, struct obj *container,
		       long *cnt_p, boolean telekinesis)
{
    int result, old_wt, new_wt, prev_encumbr, next_encumbr;

    if (obj->otyp == BOULDER && In_sokoban(&u.uz)) {
	pline("You cannot get your %s around this %s.",
			body_part(HAND), xname(obj));
	return -1;
    }
    if (obj->otyp == LOADSTONE ||
	    (obj->otyp == BOULDER && throws_rocks(youmonst.data)))
	return 1;		/* lift regardless of current situation */

    *cnt_p = carry_count(obj, container, *cnt_p, telekinesis, &old_wt, &new_wt);
    if (*cnt_p < 1L) {
	result = -1;	/* nothing lifted */
    } else if (inv_cnt() >= 52 && !merge_choice(invent, obj)) {
	pline("Your knapsack cannot accommodate any more items.");
	result = -1;	/* nothing lifted */
    } else {
	result = 1;
	prev_encumbr = near_capacity();
	if (prev_encumbr < flags.pickup_burden)
		prev_encumbr = flags.pickup_burden;
	next_encumbr = calc_capacity(new_wt - old_wt);
	if (next_encumbr > prev_encumbr) {
	    if (telekinesis) {
		result = 0;	/* don't lift */
	    } else {
		char qbuf[BUFSZ];
		long savequan = obj->quan;

		obj->quan = *cnt_p;
		strcpy(qbuf,
			(next_encumbr > HVY_ENCUMBER) ? overloadmsg :
			(next_encumbr > MOD_ENCUMBER) ? nearloadmsg :
			moderateloadmsg);
		sprintf(eos(qbuf), " %s. Continue?",
			safe_qbuf(qbuf, sizeof(" . Continue?"),
				doname(obj), an(simple_typename(obj->otyp)), "something"));
		obj->quan = savequan;
		switch (ynq(qbuf)) {
		    case 'q':  result = -1; break;
		    case 'n':  result =  0; break;
		    default:   break;	/* 'y' => result == 1 */
		}
	    }
	}
    }

    if (obj->otyp == SCR_SCARE_MONSTER && result <= 0 && !container)
	obj->spe = 0;
    return result;
}